

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O0

value_type * __thiscall
pico_tree::internal::
chunk_allocator<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>::allocate
          (chunk_allocator<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL> *this)

{
  chunk *pcVar1;
  reference pvVar2;
  size_type in_RDI;
  value_type *object;
  list_pool_resource<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>
  *in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 0x10) == 0x100) {
    pcVar1 = list_pool_resource<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>::
             allocate(in_stack_fffffffffffffff0);
    *(chunk **)(in_RDI + 0x18) = pcVar1;
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  pvVar2 = std::array<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>::operator[]
                     ((array<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL> *)
                      in_stack_fffffffffffffff0,in_RDI);
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
  return pvVar2;
}

Assistant:

inline value_type* allocate() {
    if (object_index_ == ChunkSize_) {
      chunk_ = resource_.allocate();
      object_index_ = 0;
    }

    value_type* object = &(*chunk_)[object_index_];
    object_index_++;

    return object;
  }